

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int btreeInvokeBusyHandler(void *pArg)

{
  long lVar1;
  int iVar2;
  int iVar3;
  
  lVar1 = *(long *)((long)pArg + 8);
  iVar2 = 0;
  if ((*(code **)(lVar1 + 0x2a8) != (code *)0x0) && (-1 < *(int *)(lVar1 + 0x2b8))) {
    iVar2 = (**(code **)(lVar1 + 0x2a8))(*(undefined8 *)(lVar1 + 0x2b0));
    if (iVar2 == 0) {
      iVar3 = -1;
    }
    else {
      iVar3 = *(int *)(lVar1 + 0x2b8) + 1;
    }
    *(int *)(lVar1 + 0x2b8) = iVar3;
  }
  return iVar2;
}

Assistant:

static int btreeInvokeBusyHandler(void *pArg){
  BtShared *pBt = (BtShared*)pArg;
  assert( pBt->db );
  assert( sqlite3_mutex_held(pBt->db->mutex) );
  return sqlite3InvokeBusyHandler(&pBt->db->busyHandler);
}